

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O2

int __thiscall
TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::ClassId
          (TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_> *this
          )

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZBSpStructMatrix",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = ClassId(this);
  iVar3 = TPZStructMatrixOT<std::complex<double>_>::ClassId
                    ((TPZStructMatrixOT<std::complex<double>_> *)
                     &(this->
                      super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                      ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                      field_0xa0);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZBSpStructMatrix<TVar,TPar>::ClassId() const{
    return Hash("TPZBSpStructMatrix") ^
        TPZBSpStructMatrix<TVar,TPar>::ClassId() << 1 ^
        TPar::ClassId() << 2;
}